

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_unsigned_int> google::protobuf::internal::VarintParseSlow32(char *p,uint32 res)

{
  long lVar1;
  char *pcVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  
  uVar6 = (res + (uint)(byte)p[2] * 0x4000) - 0x4000;
  if (p[2] < '\0') {
    bVar3 = 0x15;
    lVar4 = 0;
    do {
      lVar1 = lVar4;
      if (lVar1 == 2) {
        pcVar2 = (char *)0x4;
        bVar8 = true;
        goto LAB_00280572;
      }
      uVar6 = uVar6 + ((byte)p[lVar1 + 3] - 1 << (bVar3 & 0x1f));
      bVar3 = bVar3 + 7;
      lVar4 = lVar1 + 1;
    } while (p[lVar1 + 3] < '\0');
    bVar8 = 3 < lVar1 + 2U;
    lVar1 = lVar1 + 3;
  }
  else {
    lVar1 = 2;
    bVar8 = false;
  }
  pcVar2 = p + lVar1 + 1;
LAB_00280572:
  if (bVar8) {
    lVar4 = 5;
    uVar5 = 0;
    pcVar7 = p + 6;
    do {
      pcVar2 = pcVar7;
      if (-1 < pcVar2[-1]) goto LAB_00280599;
      pcVar7 = pcVar2 + 1;
      pcVar2 = (char *)0x0;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  else {
LAB_00280599:
    uVar5 = (ulong)uVar6;
  }
  pVar9._8_8_ = uVar5;
  pVar9.first = pcVar2;
  return pVar9;
}

Assistant:

std::pair<const char*, uint32> VarintParseSlow32(const char* p, uint32 res) {
  for (std::uint32_t i = 2; i < 5; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  // Accept >5 bytes
  for (std::uint32_t i = 5; i < 10; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}